

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniqueNameGenerator.cpp
# Opt level: O3

void __thiscall
Assimp::MDL::HalfLife::UniqueNameGenerator::UniqueNameGenerator(UniqueNameGenerator *this)

{
  (this->template_name_)._M_dataplus._M_p = (pointer)&(this->template_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"unnamed","");
  (this->separator_)._M_dataplus._M_p = (pointer)&(this->separator_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->separator_,"_","");
  return;
}

Assistant:

UniqueNameGenerator::UniqueNameGenerator() :
    template_name_("unnamed"),
    separator_("_") {
}